

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool ScanNumber(ConfigScanner *sc)

{
  char cVar1;
  char *__src;
  ValueType VVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  double dVar8;
  
  if (sc == (ConfigScanner *)0x0) {
    return false;
  }
  __src = sc->ptr;
  cVar1 = *__src;
  if ((cVar1 == '-') || (pcVar7 = __src, cVar1 == '+')) {
    pcVar7 = __src + 1;
    sc->ptr = pcVar7;
    cVar1 = __src[1];
  }
  if (9 < (byte)(cVar1 - 0x30U)) {
    bVar3 = false;
LAB_0014c53b:
    pcVar6 = (char *)calloc(1,((long)pcVar7 - (long)__src) + 1);
    strncpy(pcVar6,__src,(long)pcVar7 - (long)__src);
    if (bVar3) {
      dVar8 = atof(pcVar6);
      sc->current_double = dVar8;
      VVar2 = VTYPE_DOUBLE;
    }
    else {
      iVar5 = atoi(pcVar6);
      sc->current_integer = (long)iVar5;
      VVar2 = VTYPE_INTEGER;
    }
    sc->vtype = VVar2;
    free(pcVar6);
    return true;
  }
  bVar3 = false;
  do {
    pcVar6 = pcVar7 + 1;
    if (cVar1 == '.') {
      bVar4 = true;
      if (bVar3) {
        return false;
      }
    }
    else {
      bVar4 = bVar3;
      if (9 < (byte)(cVar1 - 0x30U)) goto LAB_0014c53b;
    }
    bVar3 = bVar4;
    sc->ptr = pcVar6;
    cVar1 = *pcVar6;
    pcVar7 = pcVar6;
  } while( true );
}

Assistant:

bool ScanNumber(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	char *start = sc->ptr;
	char ch = *sc->ptr;
	if (ch == '+' || ch == '-')
	{
		sc->ptr++;
		ch = *sc->ptr;
	}
	bool point = false;
	if (ch >= '0' && ch <= '9')
	{
		while (true)
		{
			if (ch == '.')
			{
				if (point)
				{
					return false;
				}
				else
				{
					point = true;
				}
				sc->ptr++;
				ch = *sc->ptr;
			}
			else if (ch >= '0' && ch <= '9')
			{
				sc->ptr++;
				ch = *sc->ptr;
			}
			else
			{
				break;
			}
		}
	}
	size_t length = sc->ptr - start;
	char *temp = (char *)malloc(length + 1);
	memset(temp, 0, length + 1);
	strncpy(temp, start, length);
	if (point)
	{
		sc->current_double = atof(temp);
		sc->vtype = VTYPE_DOUBLE;
	}
	else
	{
		sc->current_integer = atoi(temp);
		sc->vtype = VTYPE_INTEGER;
	}
	free(temp);
	return true;
}